

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

string * __thiscall
helics::helicsIntString_abi_cxx11_(string *__return_storage_ptr__,helics *this,int64_t val)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  helics *local_18 [2];
  
  fmt.size_ = 3;
  fmt.data_ = (char *)0x2;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_18;
  local_18[0] = this;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)0x3910be,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string helicsIntString(std::int64_t val)
{
    return fmt::format("{}", val);
}